

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

string * cppNameOf_abi_cxx11_(string *__return_storage_ptr__,NodePtr *n)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  char *pcVar4;
  char *pcVar5;
  NodePtr local_20;
  
  switch(n->px->type_) {
  case AVRO_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "string";
    pcVar4 = "";
    break;
  case AVRO_BYTES:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "bytes";
    pcVar4 = "";
    break;
  case AVRO_INT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "int";
    pcVar4 = "";
    break;
  case AVRO_LONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "long";
    pcVar4 = "";
    break;
  case AVRO_FLOAT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "float";
    pcVar4 = "";
    break;
  case AVRO_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "double";
    pcVar4 = "";
    break;
  case AVRO_BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "bool";
    pcVar4 = "";
    break;
  case AVRO_NULL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "null";
    pcVar4 = "";
    break;
  case AVRO_RECORD:
  case AVRO_ENUM:
  case AVRO_FIXED:
    iVar3 = (*n->px->_vptr_Node[3])();
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x20);
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x28);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
    return extraout_RAX;
  case AVRO_ARRAY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "array";
    pcVar4 = "";
    break;
  case AVRO_MAP:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "map";
    pcVar4 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "$Undefined$";
    pcVar4 = "";
    break;
  case AVRO_NUM_TYPES:
    avro::resolveSymbol((avro *)&local_20,n);
    cppNameOf_abi_cxx11_(__return_storage_ptr__,&local_20);
    boost::detail::shared_count::~shared_count(&local_20.pn);
    return extraout_RAX_00;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return extraout_RAX_01;
}

Assistant:

static string cppNameOf(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_NULL:
        return "null";
    case avro::AVRO_STRING:
        return "string";
    case avro::AVRO_BYTES:
        return "bytes";
    case avro::AVRO_INT:
        return "int";
    case avro::AVRO_LONG:
        return "long";
    case avro::AVRO_FLOAT:
        return "float";
    case avro::AVRO_DOUBLE:
        return "double";
    case avro::AVRO_BOOL:
        return "bool";
    case avro::AVRO_RECORD:
    case avro::AVRO_ENUM:
    case avro::AVRO_FIXED:
        return decorate(n->name());
    case avro::AVRO_ARRAY:
        return "array";
    case avro::AVRO_MAP:
        return "map";
    case avro::AVRO_SYMBOLIC:
        return cppNameOf(resolveSymbol(n));
    default:
        return "$Undefined$";
    }
}